

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *p;
  double *pdVar1;
  double dVar2;
  bool bVar3;
  short sVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImGuiContext *pIVar9;
  ImGuiWindow **ppIVar10;
  ImGuiWindow *pIVar11;
  long lVar12;
  undefined1 uVar13;
  uint uVar14;
  byte bVar15;
  int iVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  int iVar20;
  ulong uVar21;
  byte bVar22;
  ulong uVar23;
  ImGuiContext *g;
  bool bVar24;
  float fVar25;
  float fVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ImGuiWindow *local_98;
  ImGuiWindow *local_90;
  ImRect local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar9 = GImGui;
  local_58._8_8_ = 0;
  local_58._0_4_ = (GImGui->Style).TouchExtraPadding.x;
  local_58._4_4_ = (GImGui->Style).TouchExtraPadding.y;
  local_68 = maxps(local_58,_DAT_00184c20);
  GImGui->WindowsHoverPadding = local_68._0_8_;
  pIVar11 = pIVar9->MovingWindow;
  if (pIVar11 == (ImGuiWindow *)0x0) {
    local_98 = (ImGuiWindow *)0x0;
  }
  else {
    local_98 = (ImGuiWindow *)0x0;
    if ((pIVar11->Flags & 0x200) == 0) {
      local_98 = pIVar11;
    }
  }
  p = &(pIVar9->IO).MousePos;
  bVar24 = (pIVar9->IO).ConfigWindowsResizeFromEdges;
  local_78._1_3_ = 0;
  local_78[0] = bVar24;
  local_90 = (ImGuiWindow *)0x0;
  local_78[4] = bVar24;
  local_78._5_3_ = 0;
  local_78[8] = bVar24;
  local_78._9_7_ = 0;
  iVar16 = (pIVar9->Windows).Size;
LAB_00131bc7:
  do {
    iVar20 = iVar16;
    if (iVar20 < 1) {
LAB_00131d50:
      pIVar9->HoveredWindow = local_98;
      pIVar9->HoveredWindowUnderMovingWindow = local_90;
      pIVar11 = GetTopMostPopupModal();
      bVar24 = false;
      if ((pIVar11 != (ImGuiWindow *)0x0) && (bVar24 = false, local_98 != (ImGuiWindow *)0x0)) {
        bVar24 = IsWindowWithinBeginStackOf(local_98->RootWindow,pIVar11);
        bVar24 = !bVar24;
      }
      uVar14 = (pIVar9->IO).ConfigFlags;
      iVar16 = (pIVar9->OpenPopupStack).Size;
      uVar21 = 0xffffffffffffffff;
      uVar23 = 0;
      bVar17 = 0;
      while( true ) {
        iVar20 = (int)uVar21;
        if (uVar23 == 5) break;
        if ((pIVar9->IO).MouseClicked[uVar23] == true) {
          (pIVar9->IO).MouseDownOwned[uVar23] = 0 < iVar16 || local_98 != (ImGuiWindow *)0x0;
          (pIVar9->IO).MouseDownOwnedUnlessPopupClose[uVar23] =
               local_98 != (ImGuiWindow *)0x0 || pIVar11 != (ImGuiWindow *)0x0;
        }
        bVar3 = (pIVar9->IO).MouseDown[uVar23];
        if ((bVar3 == true) &&
           ((iVar20 == -1 ||
            (dVar2 = (pIVar9->IO).MouseClickedTime[iVar20],
            pdVar1 = (pIVar9->IO).MouseClickedTime + uVar23, *pdVar1 <= dVar2 && dVar2 != *pdVar1)))
           ) {
          uVar21 = uVar23 & 0xffffffff;
        }
        bVar17 = bVar17 & 1 | bVar3;
        uVar23 = uVar23 + 1;
      }
      bVar15 = 1;
      bVar19 = 1;
      bVar18 = 1;
      if (iVar20 != -1) {
        bVar19 = (pIVar9->IO).MouseDownOwned[iVar20];
        bVar18 = (pIVar9->IO).MouseDownOwnedUnlessPopupClose[iVar20];
      }
      bVar22 = (byte)((uVar14 & 0x10) >> 4) | bVar24;
      if (pIVar9->DragDropActive == true) {
        bVar15 = (pIVar9->DragDropSourceFlags & 0x10U) == 0 | bVar22;
      }
      if (bVar19 != 0) {
        bVar15 = bVar22;
      }
      if (bVar15 != 0) {
        pIVar9->HoveredWindow = (ImGuiWindow *)0x0;
        pIVar9->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
        local_98 = (ImGuiWindow *)0x0;
      }
      if (pIVar9->WantCaptureMouseNextFrame == -1) {
        bVar17 = local_98 != (ImGuiWindow *)0x0 | bVar17;
        (pIVar9->IO).WantCaptureMouse = (bool)(bVar19 & bVar17 | 0 < iVar16);
        bVar17 = bVar18 & bVar17 | pIVar11 != (ImGuiWindow *)0x0;
        lVar12 = 0x35d0;
      }
      else {
        bVar17 = pIVar9->WantCaptureMouseNextFrame != 0;
        (pIVar9->IO).WantCaptureMouseUnlessPopupClose = (bool)bVar17;
        lVar12 = 0xd0;
      }
      (&pIVar9->Initialized)[lVar12] = (bool)bVar17;
      if (pIVar9->WantCaptureKeyboardNextFrame == -1) {
        bVar24 = pIVar9->ActiveId != 0 || pIVar11 != (ImGuiWindow *)0x0;
      }
      else {
        bVar24 = pIVar9->WantCaptureKeyboardNextFrame != 0;
      }
      uVar14 = uVar14 & 9;
      uVar13 = (char)uVar14;
      if (uVar14 != 1) {
        uVar13 = bVar24;
      }
      if ((pIVar9->IO).NavActive == false) {
        uVar13 = bVar24;
      }
      (pIVar9->IO).WantCaptureKeyboard = (bool)uVar13;
      (pIVar9->IO).WantTextInput = pIVar9->WantTextInputNextFrame - 1U < 0xfffffffe;
      return;
    }
    iVar16 = iVar20 + -1;
    ppIVar10 = ImVector<ImGuiWindow_*>::operator[](&pIVar9->Windows,iVar16);
    pIVar11 = *ppIVar10;
  } while (((pIVar11->Active != true) || (pIVar11->Hidden != false)) ||
          ((pIVar11->Flags & 0x200) != 0));
  IVar7 = (pIVar11->OuterRectClipped).Min;
  IVar8 = (pIVar11->OuterRectClipped).Max;
  bVar24 = (pIVar11->Flags & 0x1000042U) == 0;
  auVar26._1_3_ = 0;
  auVar26[0] = bVar24;
  auVar26[4] = bVar24;
  auVar26._5_3_ = 0;
  auVar26[8] = bVar24;
  auVar26._9_7_ = 0;
  auVar26 = auVar26 & local_78;
  auVar27._0_4_ = (auVar26._0_4_ << 0x1f) >> 0x1f;
  auVar27._4_4_ = (auVar26._4_4_ << 0x1f) >> 0x1f;
  auVar27._8_4_ = (auVar26._8_4_ << 0x1f) >> 0x1f;
  auVar27._12_4_ = (auVar26._12_4_ << 0x1f) >> 0x1f;
  auVar26 = ~auVar27 & local_58 | local_68 & auVar27;
  fVar25 = auVar26._0_4_;
  fVar28 = auVar26._4_4_;
  auVar5._4_8_ = SUB168(local_68 & auVar27,8);
  auVar5._0_4_ = fVar28;
  auVar29._0_8_ = auVar5._0_8_ << 0x20;
  auVar29._8_4_ = fVar25;
  auVar29._12_4_ = fVar28;
  local_88.Min.x = IVar7.x;
  local_88.Min.y = IVar7.y;
  local_88.Max.x = IVar8.x;
  local_88.Max.y = IVar8.y;
  auVar6._4_8_ = auVar29._8_8_;
  auVar6._0_4_ = fVar28 + local_88.Min.y;
  auVar30._0_8_ = auVar6._0_8_ << 0x20;
  auVar30._8_4_ = fVar25 + local_88.Max.x;
  auVar30._12_4_ = fVar28 + local_88.Max.y;
  local_88.Max = auVar30._8_8_;
  local_88.Min.y = local_88.Min.y - fVar28;
  local_88.Min.x = local_88.Min.x - fVar25;
  bVar24 = ImRect::Contains(&local_88,p);
  if (bVar24) {
    sVar4 = (pIVar11->HitTestHoleSize).x;
    if (sVar4 != 0) {
      auVar26 = pshuflw(ZEXT416((uint)pIVar11->HitTestHoleOffset),
                        ZEXT416((uint)pIVar11->HitTestHoleOffset),0x60);
      local_40.Min.x = (float)(auVar26._0_4_ >> 0x10) + (pIVar11->Pos).x;
      local_40.Min.y = (float)(auVar26._4_4_ >> 0x10) + (pIVar11->Pos).y;
      local_40.Max.x = (float)(int)sVar4 + local_40.Min.x;
      local_40.Max.y =
           (float)(int)((long)((ulong)(ushort)(pIVar11->HitTestHoleSize).y << 0x30) >> 0x30) +
           local_40.Min.y;
      bVar24 = ImRect::Contains(&local_40,p);
      if (bVar24) goto LAB_00131bc7;
    }
    if (local_98 == (ImGuiWindow *)0x0) {
      local_98 = pIVar11;
    }
    if (((local_90 == (ImGuiWindow *)0x0) &&
        (local_90 = pIVar11, pIVar9->MovingWindow != (ImGuiWindow *)0x0)) &&
       (pIVar11->RootWindow == pIVar9->MovingWindow->RootWindow)) {
      local_90 = (ImGuiWindow *)0x0;
    }
    else {
      if (local_98 != (ImGuiWindow *)0x0) goto LAB_00131d50;
      local_98 = (ImGuiWindow *)0x0;
    }
  }
  iVar16 = iVar20 + -1;
  goto LAB_00131bc7;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowWithinBeginStackOf(g.HoveredWindow->RootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and
    // won't report hovering nor request capture even while dragging over our windows afterward.
    const bool has_open_popup = (g.OpenPopupStack.Size > 0);
    const bool has_open_modal = (modal_window != NULL);
    int mouse_earliest_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(io.MouseDown); i++)
    {
        if (io.MouseClicked[i])
        {
            io.MouseDownOwned[i] = (g.HoveredWindow != NULL) || has_open_popup;
            io.MouseDownOwnedUnlessPopupClose[i] = (g.HoveredWindow != NULL) || has_open_modal;
        }
        mouse_any_down |= io.MouseDown[i];
        if (io.MouseDown[i])
            if (mouse_earliest_down == -1 || io.MouseClickedTime[i] < io.MouseClickedTime[mouse_earliest_down])
                mouse_earliest_down = i;
    }
    const bool mouse_avail = (mouse_earliest_down == -1) || io.MouseDownOwned[mouse_earliest_down];
    const bool mouse_avail_unless_popup_close = (mouse_earliest_down == -1) || io.MouseDownOwnedUnlessPopupClose[mouse_earliest_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to Dear ImGui only, false = dispatch mouse to Dear ImGui + underlying app)
    // Update io.WantCaptureMouseAllowPopupClose (experimental) to give a chance for app to react to popup closure with a drag
    if (g.WantCaptureMouseNextFrame != -1)
    {
        io.WantCaptureMouse = io.WantCaptureMouseUnlessPopupClose = (g.WantCaptureMouseNextFrame != 0);
    }
    else
    {
        io.WantCaptureMouse = (mouse_avail && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_popup;
        io.WantCaptureMouseUnlessPopupClose = (mouse_avail_unless_popup_close && (g.HoveredWindow != NULL || mouse_any_down)) || has_open_modal;
    }

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to Dear ImGui only, false = dispatch keyboard info to Dear ImGui + underlying app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        io.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        io.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (io.NavActive && (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(io.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        io.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    io.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}